

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpls.cpp
# Opt level: O2

int adios2::utils::compile_regexp_masks(void)

{
  regex_t *prVar1;
  int __errcode;
  regex_t *__preg;
  int i;
  long lVar2;
  char buf [256];
  
  lVar2 = 0;
  prVar1 = (regex_t *)varregex;
  do {
    __preg = prVar1;
    if (nmasks <= lVar2) {
      return 0;
    }
    __errcode = regcomp(__preg,(char *)(&varmask)[lVar2],1);
    lVar2 = lVar2 + 1;
    prVar1 = __preg + 1;
  } while (__errcode == 0);
  regerror(__errcode,__preg,buf,0x100);
  fprintf(_stderr,"Error: \"%s\" is an invalid extended regular expression: %s\n",
          *(undefined8 *)(lVar2 * 8 + 0x178838),buf);
  return 2;
}

Assistant:

int compile_regexp_masks(void)
{
#ifdef USE_C_REGEX
    int errcode;
    char buf[256];
    for (int i = 0; i < nmasks; i++)
    {
        errcode = regcomp(&(varregex[i]), varmask[i], REG_EXTENDED);
        if (errcode)
        {
            regerror(errcode, &(varregex[i]), buf, sizeof(buf));
            fprintf(stderr,
                    "Error: \"%s\" is an invalid extended regular "
                    "expression: %s\n",
                    varmask[i], buf);
            return 2;
        }
    }
#else
    varregex.reserve(nmasks);
    for (int i = 0; i < nmasks; i++)
    {
        try
        {
            varregex.push_back(std::regex(varmask[i]));
        }
        catch (std::regex_error &e)
        {
            fprintf(stderr,
                    "Error: \"%s\" is an invalid extended regular "
                    "expression. C++ regex error code: %d\n",
                    varmask[i], e.code() == std::regex_constants::error_badrepeat);
            return 2;
        }
    }
#endif
    return 0;
}